

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O2

string * ChecksumNameShort_abi_cxx11_
                   (string *__return_storage_ptr__,
                   set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                   *methods)

{
  bool bVar1;
  _Base_ptr p_Var2;
  stringstream ss;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  p_Var2 = (methods->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = true;
  while ((_Rb_tree_header *)p_Var2 != &(methods->_M_t)._M_impl.super__Rb_tree_header) {
    if (!bVar1) {
      std::operator<<(local_1a8,"|");
    }
    if ((ulong)p_Var2[1]._M_color < 7) {
      std::operator<<(local_1a8,
                      &DAT_001a8e24 + *(int *)(&DAT_001a8e24 + (ulong)p_Var2[1]._M_color * 4));
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    bVar1 = false;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string ChecksumNameShort(std::set<ChecksumType> methods)
{
    std::stringstream ss;
    bool first = true;

    for (auto& m : methods)
    {
        if (!first)
            ss << "|";
        first = false;

        switch (m)
        {
        case ChecksumType::None:            ss << "none"; break;
        case ChecksumType::Constant_8C15:   ss << "8C15"; break;
        case ChecksumType::Sum_1800:        ss << "sum"; break;
        case ChecksumType::XOR_1800:        ss << "xor"; break;
        case ChecksumType::XOR_18A0:        ss << "xorA0"; break;
        case ChecksumType::CRC_D2F6_1800:   ss << "crc0"; break;
        case ChecksumType::CRC_D2F6_1802:   ss << "crc2"; break;
        }
    }

    return ss.str();
}